

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_decompress.c
# Opt level: O0

int read_data_cross_bytes(byte_t *input_buffer,int max_bits_to_read,byte_t *sub_buffer)

{
  int read_pos;
  int write_pos;
  long lVar1;
  long lVar2;
  int local_4c;
  long input_byte_idx;
  long sub_byte_idx;
  int write_bit_idx;
  int read_bit_idx;
  int bits_to_copy;
  int in_available_bits;
  int sub_buffer_bit_idx;
  byte_t *sub_buffer_local;
  int max_bits_to_read_local;
  byte_t *input_buffer_local;
  
  bits_to_copy = 0;
  sub_buffer_local._4_4_ = max_bits_to_read;
  for (; (0 < sub_buffer_local._4_4_ && (in_bit_idx <= last_bit_idx));
      in_bit_idx = local_4c + in_bit_idx) {
    local_4c = get_available_bits(in_bit_idx);
    if (sub_buffer_local._4_4_ < local_4c) {
      local_4c = sub_buffer_local._4_4_;
    }
    read_pos = bit_pos_in_current_byte(in_bit_idx);
    write_pos = bit_pos_in_current_byte((long)bits_to_copy);
    lVar2 = bit_idx_to_byte_idx((long)bits_to_copy);
    lVar1 = bit_idx_to_byte_idx(in_bit_idx);
    bit_copy(input_buffer[lVar1],sub_buffer + lVar2,read_pos,write_pos,local_4c);
    bits_to_copy = local_4c + bits_to_copy;
    sub_buffer_local._4_4_ = sub_buffer_local._4_4_ - local_4c;
  }
  lVar2 = bit_idx_to_byte_idx((long)(bits_to_copy + -1));
  return (int)lVar2 + 1;
}

Assistant:

int read_data_cross_bytes(const byte_t input_buffer[], int max_bits_to_read, byte_t sub_buffer[]) {
#ifdef _DEBUG
    log_debug("  read_data_cross_bytes", "in_bit_idx=%-8u last_bit_idx=%u max_bits_to_read=%-8d\n",
            in_bit_idx, last_bit_idx, max_bits_to_read);
#endif

    int sub_buffer_bit_idx = 0;
    while(max_bits_to_read > 0) {
        if(in_bit_idx > last_bit_idx) {
#ifdef _DEBUG
            log_debug("  read_data_cross_bytes",
                    "in_bit_idx=%-8u last_bit_idx=%u max_bits_to_read=%-8d (in_bit_idx > last_bit_idx) break\n",
                    in_bit_idx, last_bit_idx, max_bits_to_read);
#endif
            break;
        }

        int in_available_bits = get_available_bits(in_bit_idx);
        int bits_to_copy = in_available_bits > max_bits_to_read ? max_bits_to_read : in_available_bits;

        int read_bit_idx = bit_pos_in_current_byte(in_bit_idx);
        int write_bit_idx = bit_pos_in_current_byte(sub_buffer_bit_idx);
        long sub_byte_idx = bit_idx_to_byte_idx(sub_buffer_bit_idx);

        // copy bits from most significant bit to least significant
        // e.g. from 5th and size 4 -> 5,4,3,2
        long input_byte_idx = bit_idx_to_byte_idx(in_bit_idx);
        bit_copy(input_buffer[input_byte_idx], &sub_buffer[sub_byte_idx], read_bit_idx, write_bit_idx, bits_to_copy);

        in_bit_idx += bits_to_copy;
        sub_buffer_bit_idx += bits_to_copy;
        max_bits_to_read -= bits_to_copy;
    }

    return bit_idx_to_byte_idx(sub_buffer_bit_idx-1) + 1;
}